

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceAttribsVk.hpp
# Opt level: O0

VkDescriptorType Diligent::DescriptorTypeToVkDescriptorType(DescriptorType Type)

{
  Char *Message;
  undefined1 local_30 [8];
  string msg;
  DescriptorType Type_local;
  
  switch(Type) {
  case Sampler:
    msg.field_2._12_4_ = 0;
    break;
  case CombinedImageSampler:
    msg.field_2._12_4_ = 1;
    break;
  case SeparateImage:
    msg.field_2._12_4_ = 2;
    break;
  case StorageImage:
    msg.field_2._12_4_ = 3;
    break;
  case UniformTexelBuffer:
    msg.field_2._12_4_ = 4;
    break;
  case StorageTexelBuffer:
    msg.field_2._12_4_ = 5;
    break;
  case StorageTexelBuffer_ReadOnly:
    msg.field_2._12_4_ = 5;
    break;
  case UniformBuffer:
    msg.field_2._12_4_ = 6;
    break;
  case UniformBufferDynamic:
    msg.field_2._12_4_ = 8;
    break;
  case StorageBuffer:
    msg.field_2._12_4_ = 7;
    break;
  case StorageBuffer_ReadOnly:
    msg.field_2._12_4_ = 7;
    break;
  case StorageBufferDynamic:
    msg.field_2._12_4_ = 9;
    break;
  case StorageBufferDynamic_ReadOnly:
    msg.field_2._12_4_ = 9;
    break;
  case InputAttachment:
    msg.field_2._12_4_ = 10;
    break;
  case InputAttachment_General:
    msg.field_2._12_4_ = 10;
    break;
  case AccelerationStructure:
    msg.field_2._12_4_ = 0x3b9d13f0;
    break;
  default:
    msg.field_2._M_local_buf[0xb] = Type;
    FormatString<char[24]>((string *)local_30,(char (*) [24])"Unknown descriptor type");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"DescriptorTypeToVkDescriptorType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/PipelineResourceAttribsVk.hpp"
               ,0xc5);
    std::__cxx11::string::~string((string *)local_30);
    msg.field_2._12_4_ = 0x7fffffff;
  }
  return msg.field_2._12_4_;
}

Assistant:

inline VkDescriptorType DescriptorTypeToVkDescriptorType(DescriptorType Type)
{
    static_assert(static_cast<Uint32>(DescriptorType::Count) == 16, "Please update the switch below to handle the new descriptor type");
    switch (Type)
    {
        // clang-format off
        case DescriptorType::Sampler:                       return VK_DESCRIPTOR_TYPE_SAMPLER;
        case DescriptorType::CombinedImageSampler:          return VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
        case DescriptorType::SeparateImage:                 return VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE;
        case DescriptorType::StorageImage:                  return VK_DESCRIPTOR_TYPE_STORAGE_IMAGE;
        case DescriptorType::UniformTexelBuffer:            return VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER;
        case DescriptorType::StorageTexelBuffer:            return VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER;
        case DescriptorType::StorageTexelBuffer_ReadOnly:   return VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER;
        case DescriptorType::UniformBuffer:                 return VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER;
        case DescriptorType::UniformBufferDynamic:          return VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER_DYNAMIC;
        case DescriptorType::StorageBuffer:                 return VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
        case DescriptorType::StorageBuffer_ReadOnly:        return VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
        case DescriptorType::StorageBufferDynamic:          return VK_DESCRIPTOR_TYPE_STORAGE_BUFFER_DYNAMIC;
        case DescriptorType::StorageBufferDynamic_ReadOnly: return VK_DESCRIPTOR_TYPE_STORAGE_BUFFER_DYNAMIC;
        case DescriptorType::InputAttachment:               return VK_DESCRIPTOR_TYPE_INPUT_ATTACHMENT;
        case DescriptorType::InputAttachment_General:       return VK_DESCRIPTOR_TYPE_INPUT_ATTACHMENT;
        case DescriptorType::AccelerationStructure:         return VK_DESCRIPTOR_TYPE_ACCELERATION_STRUCTURE_KHR;
        // clang-format on
        default:
            UNEXPECTED("Unknown descriptor type");
            return VK_DESCRIPTOR_TYPE_MAX_ENUM;
    }
}